

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O0

_Bool i2cp_parse_payload(i2cp_payload *p)

{
  uint16_t uVar1;
  int iVar2;
  undefined8 *in_RDI;
  z_stream *gzip;
  int err;
  _Bool ret;
  bool local_9;
  
  local_9 = false;
  uVar1 = bufbe16toh((void *)0x106e23);
  *(uint16_t *)((long)in_RDI + 0x1007a) = uVar1;
  uVar1 = bufbe16toh((void *)0x106e47);
  *(uint16_t *)((long)in_RDI + 0x1007c) = uVar1;
  *(undefined1 *)(in_RDI + 0x200f) = *(undefined1 *)(in_RDI[0x2010] + 9);
  memset(in_RDI,0,0x70);
  inflateInit2_(in_RDI,0x1f,"1.2.11",0x70);
  *in_RDI = in_RDI[0x2010];
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RDI + 0x2011);
  in_RDI[3] = in_RDI + 0xe;
  *(undefined4 *)(in_RDI + 4) = 0x10000;
  iVar2 = inflate(in_RDI,0);
  if (iVar2 == 1) {
    in_RDI[0x200e] = 0x10000 - (ulong)*(uint *)(in_RDI + 4);
    local_9 = (ulong)in_RDI[0x200e] < 0x10001;
  }
  inflateEnd(in_RDI);
  return local_9;
}

Assistant:

bool i2cp_parse_payload(struct i2cp_payload * p)
{
  bool ret = false;
  int err;

  p->srcport = bufbe16toh(p->ptr + 4);
  p->dstport = bufbe16toh(p->ptr + 6);
  p->proto = p->ptr[9];
  
  z_stream * gzip = &p->gzip;
  
  memset(gzip, 0, sizeof(z_stream));
  inflateInit2(gzip, MAX_WBITS + 16);

  gzip->next_in = p->ptr;
  gzip->avail_in = p->ptrlen;
  gzip->next_out = p->payload;
  gzip->avail_out = sizeof(p->payload);

  err = inflate(gzip, Z_NO_FLUSH);
  if(err == Z_STREAM_END)
  {
    p->sz = sizeof(p->payload) - gzip->avail_out;
    ret = p->sz <= sizeof(p->payload);
  }
  inflateEnd(gzip);
  return ret;
}